

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

string * __thiscall
helics::RerouteFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,RerouteFilterOperation *this,string_view property)

{
  size_t sVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  allocator<char> local_41;
  handle cond;
  
  __y._M_str = "newdestination";
  __y._M_len = 0xe;
  bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y);
  if (bVar2) {
    gmlc::libguarded::
    atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
    ::load(__return_storage_ptr__,&this->newDest);
  }
  else {
    __y_00._M_str = "condition";
    __y_00._M_len = 9;
    bVar2 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y_00);
    if (bVar2) {
      gmlc::libguarded::
      shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::lock(&cond,&this->conditions);
      sVar1 = ((cond.data)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      if (sVar1 == 1) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (((cond.data)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 1));
      }
      else if (sVar1 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"[",&local_41);
        for (p_Var3 = ((cond.data)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var3 != &((cond.data)->_M_t)._M_impl.super__Rb_tree_header;
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,'\"');
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,'\"');
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,',');
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
      }
      std::unique_lock<std::shared_mutex>::~unique_lock(&cond.m_handle_lock);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RerouteFilterOperation::getString(std::string_view property)
{
    if (property == "newdestination") {
        return newDest.load();
    }
    if (property == "condition") {
        auto cond = conditions.lock();
        if (cond->empty()) {
            return {};
        }
        if (cond->size() == 1) {
            return *cond->begin();
        }
        std::string results{"["};
        for (const auto& condition : cond) {
            results.push_back('"');
            results.append(condition);
            results.push_back('"');
            results.push_back(',');
        }
        results.pop_back();
        results.push_back(']');
        return results;
    }
    return FilterOperations::getString(property);
}